

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  Byte *compr;
  Byte *uncompr;
  uLong local_28;
  
  local_28 = 40000;
  pcVar2 = (char *)zlibVersion();
  if (*pcVar2 == '1') {
    pcVar2 = (char *)zlibVersion();
    iVar1 = strcmp(pcVar2,"1.2.8");
    if (iVar1 != 0) {
      main_cold_2();
    }
    uVar3 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar3);
    compr = (Byte *)calloc(40000,1);
    uncompr = (Byte *)calloc(40000,1);
    if ((compr != (Byte *)0x0) && (uncompr != (Byte *)0x0)) {
      test_compress(compr,40000,uncompr,40000);
      if (argc < 2) {
        pcVar2 = "foo.gz";
      }
      else {
        pcVar2 = argv[1];
      }
      test_gzio(pcVar2,uncompr,40000);
      test_deflate(compr,40000);
      test_inflate(compr,40000,uncompr,40000);
      test_large_deflate(compr,40000,uncompr,40000);
      test_large_inflate(compr,40000,uncompr,40000);
      test_flush(compr,&local_28);
      test_sync(compr,local_28,uncompr,40000);
      test_dict_deflate(compr,40000);
      test_dict_inflate(compr,40000,uncompr,40000);
      free(compr);
      free(uncompr);
      return 0;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    Byte *compr, *uncompr;
    uLong comprLen = 10000*sizeof(int); /* don't overflow on MSDOS */
    uLong uncomprLen = comprLen;
    static const char* myVersion = ZLIB_VERSION;

    if (zlibVersion()[0] != myVersion[0]) {
        fprintf(stderr, "incompatible zlib version\n");
        exit(1);

    } else if (strcmp(zlibVersion(), ZLIB_VERSION) != 0) {
        fprintf(stderr, "warning: different zlib version\n");
    }

    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n",
            ZLIB_VERSION, ZLIB_VERNUM, zlibCompileFlags());

    compr    = (Byte*)calloc((uInt)comprLen, 1);
    uncompr  = (Byte*)calloc((uInt)uncomprLen, 1);
    /* compr and uncompr are cleared to avoid reading uninitialized
     * data and to ensure that uncompr compresses well.
     */
    if (compr == Z_NULL || uncompr == Z_NULL) {
        printf("out of memory\n");
        exit(1);
    }

#ifdef Z_SOLO
    argc = strlen(argv[0]);
#else
    test_compress(compr, comprLen, uncompr, uncomprLen);

    test_gzio((argc > 1 ? argv[1] : TESTFILE),
              uncompr, uncomprLen);
#endif

    test_deflate(compr, comprLen);
    test_inflate(compr, comprLen, uncompr, uncomprLen);

    test_large_deflate(compr, comprLen, uncompr, uncomprLen);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);

    test_flush(compr, &comprLen);
    test_sync(compr, comprLen, uncompr, uncomprLen);
    comprLen = uncomprLen;

    test_dict_deflate(compr, comprLen);
    test_dict_inflate(compr, comprLen, uncompr, uncomprLen);

    free(compr);
    free(uncompr);

    return 0;
}